

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.h
# Opt level: O2

void __thiscall dg::LLVMDependenceGraph::LLVMDependenceGraph(LLVMDependenceGraph *this,bool threads)

{
  DependenceGraph<dg::LLVMNode>::DependenceGraph((DependenceGraph<dg::LLVMNode> *)this);
  *(code **)this = dg::pta::LLVMPointerGraphBuilder::matchJoinToRightCreate;
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0xe8) = 0;
  *(undefined8 *)(this + 0xf0) = 0;
  this[0x108] = (LLVMDependenceGraph)threads;
  *(undefined4 *)(this + 0x118) = 0;
  *(undefined8 *)(this + 0x120) = 0;
  *(LLVMDependenceGraph **)(this + 0x128) = this + 0x118;
  *(LLVMDependenceGraph **)(this + 0x130) = this + 0x118;
  *(undefined8 *)(this + 0x138) = 0;
  *(undefined8 *)(this + 0x140) = 0;
  *(undefined8 *)(this + 0x148) = 0;
  return;
}

Assistant:

LLVMDependenceGraph(bool threads = false) : threads(threads) {}